

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonarray.cpp
# Opt level: O1

bool comparesEqual(QJsonArray *lhs,QJsonArray *rhs)

{
  QCborContainerPrivate *pQVar1;
  long lVar2;
  bool bVar3;
  QCborContainerPrivate *pQVar4;
  ulong idx;
  long in_FS_OFFSET;
  bool bVar5;
  QCborValue local_68;
  QCborValue local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = (rhs->a).d.ptr;
  pQVar1 = (lhs->a).d.ptr;
  if (pQVar1 == pQVar4) {
    bVar5 = true;
  }
  else {
    if (pQVar1 == (QCborContainerPrivate *)0x0) {
      lVar2 = (pQVar4->elements).d.size;
    }
    else {
      lVar2 = (pQVar1->elements).d.size;
      if (pQVar4 != (QCborContainerPrivate *)0x0) {
        if (lVar2 == (pQVar4->elements).d.size) {
          pQVar4 = (lhs->a).d.ptr;
          bVar5 = (pQVar4->elements).d.size == 0;
          if (!bVar5) {
            idx = 0;
            do {
              QCborContainerPrivate::valueAt(&local_50,pQVar4,idx);
              QCborContainerPrivate::valueAt(&local_68,(rhs->a).d.ptr,idx);
              bVar3 = comparesEqual(&local_50,&local_68);
              QCborValue::~QCborValue((QCborValue *)&local_68);
              QCborValue::~QCborValue((QCborValue *)&local_50);
              if (!bVar3) break;
              idx = idx + 1;
              pQVar4 = (lhs->a).d.ptr;
              bVar3 = idx < (ulong)(pQVar4->elements).d.size;
              bVar5 = !bVar3;
            } while (bVar3);
          }
        }
        else {
          bVar5 = false;
        }
        goto LAB_002f12e0;
      }
    }
    bVar5 = lVar2 == 0;
  }
LAB_002f12e0:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool comparesEqual(const QJsonArray &lhs, const QJsonArray &rhs)
{
    if (lhs.a == rhs.a)
        return true;

    if (!lhs.a)
        return !rhs.a->elements.size();
    if (!rhs.a)
        return !lhs.a->elements.size();
    if (lhs.a->elements.size() != rhs.a->elements.size())
        return false;

    for (qsizetype i = 0; i < lhs.a->elements.size(); ++i) {
        if (lhs.a->valueAt(i) != rhs.a->valueAt(i))
            return false;
    }
    return true;
}